

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HilbertCurve.h
# Opt level: O3

size_t anurbs::HilbertCurve<3L>::d(size_t i)

{
  long lVar1;
  size_t sVar2;
  ulong uVar3;
  
  if (i != 0) {
    if ((i & 1) == 0) {
      uVar3 = i - 1;
    }
    else {
      uVar3 = i + 1;
    }
    uVar3 = (uVar3 ^ i) >> 1 ^ uVar3 ^ i;
    lVar1 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    sVar2 = 0;
    if (1 < uVar3) {
      sVar2 = (ulong)(byte)((char)lVar1 + (char)(((uint)lVar1 & 0xff) * 0x56 >> 8) * -3);
    }
    return sVar2;
  }
  return 0;
}

Assistant:

static size_t d(const size_t i) noexcept
    {
        if (i == 0) {
            return 0;
        } else if (i % 2 == 0) {
            return g(i - 1) % TDimension;
        } else {
            return g(i) % TDimension;
        }
    }